

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v6::internal::
     handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>>
               (char spec,int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *handler)

{
  char in_DIL;
  int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *unaff_retaddr;
  int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *in_stack_00000040;
  int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *in_stack_000000e0;
  
  if (in_DIL == '\0') {
LAB_002156ec:
    basic_writer<fmt::v6::buffer_range<char>_>::
    int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_dec(in_stack_00000040);
    return;
  }
  if (in_DIL == 'B') {
LAB_00215704:
    basic_writer<fmt::v6::buffer_range<char>_>::
    int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_bin(in_stack_00000040);
  }
  else {
    if (in_DIL != 'X') {
      if (in_DIL == 'b') goto LAB_00215704;
      if (in_DIL == 'd') goto LAB_002156ec;
      if (in_DIL == 'n') {
        basic_writer<fmt::v6::buffer_range<char>_>::
        int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_num(in_stack_000000e0);
        return;
      }
      if (in_DIL == 'o') {
        basic_writer<fmt::v6::buffer_range<char>_>::
        int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_oct(in_stack_00000040);
        return;
      }
      if (in_DIL != 'x') {
        basic_writer<fmt::v6::buffer_range<char>_>::
        int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_error(unaff_retaddr);
      }
    }
    basic_writer<fmt::v6::buffer_range<char>_>::
    int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_hex(in_stack_00000040);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}